

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeReturn(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this)

{
  Return *expr;
  undefined1 local_80 [8];
  Return curr;
  undefined1 local_48 [8];
  Result<wasm::Ok> _val;
  
  if (this->func == (Function *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_48,"return is only valid in a function context",
               (allocator<char> *)&curr.value);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_48);
    std::__cxx11::string::~string((string *)local_48);
  }
  else {
    local_80[0] = ReturnId;
    curr.super_SpecificExpression<(wasm::Expression::Id)19>.super_Expression.type.id = 0;
    curr.super_SpecificExpression<(wasm::Expression::Id)19>.super_Expression._id = BlockId;
    curr.super_SpecificExpression<(wasm::Expression::Id)19>.super_Expression._1_7_ = 0;
    visitExpression((Result<wasm::Ok> *)local_48,this,(Expression *)local_80);
    if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string((string *)&curr.value,(string *)local_48);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&curr.value);
      std::__cxx11::string::~string((string *)&curr.value);
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_48);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_48);
      expr = Builder::makeReturn(&this->builder,
                                 (Expression *)
                                 curr.super_SpecificExpression<(wasm::Expression::Id)19>.
                                 super_Expression.type.id);
      push(this,(Expression *)expr);
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeReturn() {
  if (!func) {
    return Err{"return is only valid in a function context"};
  }
  Return curr;
  CHECK_ERR(visitReturn(&curr));
  push(builder.makeReturn(curr.value));
  return Ok{};
}